

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O2

idx_t duckdb::StringSplitter::Split<duckdb::RegexpStringSplit>
                (string_t input,string_t delim,StringSplitInput *state,void *data)

{
  idx_t split_size;
  idx_t list_idx;
  char *delim_data;
  ulong input_size;
  char *input_data;
  idx_t match_size;
  StringSplitInput *local_60;
  void *local_58;
  string_t delim_local;
  string_t input_local;
  
  delim_local.value.pointer.ptr = (char *)delim.value._8_8_;
  delim_local.value._0_8_ = delim.value._0_8_;
  input_local.value.pointer.ptr = (char *)input.value._8_8_;
  input_local.value._0_8_ = input.value._0_8_;
  input_data = input_local.value.pointer.ptr;
  if (input.value._0_4_ < 0xd) {
    input_data = input_local.value.pointer.prefix;
  }
  input_size = (ulong)input.value._0_4_;
  delim_data = delim_local.value.pointer.ptr;
  if (delim.value._0_4_ < 0xd) {
    delim_data = delim_local.value.pointer.prefix;
  }
  list_idx = 0;
  local_60 = state;
  local_58 = data;
  for (; input_size != 0; input_size = input_size - (split_size + match_size)) {
    match_size = 0;
    split_size = RegexpStringSplit::Find
                           (input_data,input_size,delim_data,(ulong)delim.value._0_4_,&match_size,
                            local_58);
    if ((input_size < split_size) ||
       ((match_size == 0 && split_size == 0 &&
        ((split_size = 1, input_size == 1 || (input_size == 1)))))) break;
    StringSplitInput::AddSplit(local_60,input_data,split_size,list_idx);
    list_idx = list_idx + 1;
    input_data = input_data + split_size + match_size;
  }
  StringSplitInput::AddSplit(local_60,input_data,input_size,list_idx);
  return list_idx + 1;
}

Assistant:

static idx_t Split(string_t input, string_t delim, StringSplitInput &state, void *data) {
		auto input_data = input.GetData();
		auto input_size = input.GetSize();
		auto delim_data = delim.GetData();
		auto delim_size = delim.GetSize();
		idx_t list_idx = 0;
		while (input_size > 0) {
			idx_t match_size = 0;
			auto pos = OP::Find(input_data, input_size, delim_data, delim_size, match_size, data);
			if (pos > input_size) {
				break;
			}
			if (match_size == 0 && pos == 0) {
				// special case: 0 length match and pos is 0
				// move to the next character
				for (pos++; pos < input_size; pos++) {
					if (IsCharacter(input_data[pos])) {
						break;
					}
				}
				if (pos == input_size) {
					break;
				}
			}
			D_ASSERT(input_size >= pos + match_size);
			state.AddSplit(input_data, pos, list_idx);

			list_idx++;
			input_data += (pos + match_size);
			input_size -= (pos + match_size);
		}
		state.AddSplit(input_data, input_size, list_idx);
		list_idx++;
		return list_idx;
	}